

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testHeader.cpp
# Opt level: O0

void __thiscall
Test<const_Imf_3_4::Header>::testIterators(Test<const_Imf_3_4::Header> *this,string *name)

{
  bool bVar1;
  Attribute *pAVar2;
  Attribute *pAVar3;
  ConstIterator iterator;
  Attribute *comparand;
  Header header;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  Vec2<float> local_50;
  Header local_48 [72];
  
  Imath_3_2::Vec2<float>::Vec2(&local_50,0.0,0.0);
  Imf_3_4::Header::Header(local_48,0x40,0x40,1.0,(Vec2 *)&local_50,1.0,INCREASING_Y,ZIP_COMPRESSION)
  ;
  Imf_3_4::Header::find((char *)local_48);
  pAVar2 = Imf_3_4::Header::ConstIterator::attribute((ConstIterator *)0x19f4a7);
  Imf_3_4::Header::begin();
  while( true ) {
    Imf_3_4::Header::end();
    in_stack_ffffffffffffff57 =
         Imf_3_4::operator!=((ConstIterator *)
                             CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                             (ConstIterator *)in_stack_ffffffffffffff48);
    if (!(bool)in_stack_ffffffffffffff57) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testHeader.cpp"
                    ,0x39,
                    "void Test<const Imf_3_4::Header>::testIterators(const string &) [Header = const Imf_3_4::Header]"
                   );
    }
    in_stack_ffffffffffffff48 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         Imf_3_4::Header::ConstIterator::name((ConstIterator *)0x19f50e);
    bVar1 = std::operator==((char *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                            in_stack_ffffffffffffff48);
    if (bVar1) break;
    Imf_3_4::Header::ConstIterator::operator++
              ((ConstIterator *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
  }
  pAVar3 = Imf_3_4::Header::ConstIterator::attribute((ConstIterator *)0x19f535);
  if (pAVar3 == pAVar2) {
    Imf_3_4::Header::~Header(local_48);
    return;
  }
  __assert_fail("&iterator.attribute () == &comparand",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testHeader.cpp"
                ,0x34,
                "void Test<const Imf_3_4::Header>::testIterators(const string &) [Header = const Imf_3_4::Header]"
               );
}

Assistant:

void testIterators (const string& name)
    {
        Header header;

        auto& comparand = header.find ("displayWindow").attribute ();

        for (auto iterator = header.begin (); iterator != header.end ();
             ++iterator)
        {
            if (iterator.name () == name)
            {
                assert (&iterator.attribute () == &comparand);
                return;
            }
        }

        assert (false);
    }